

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall CTcGramProdTok::set_match_part_list(CTcGramProdTok *this)

{
  void *pvVar1;
  size_t in_RDI;
  CTcPrsMem *unaff_retaddr;
  size_t init_alo;
  
  *(undefined4 *)(in_RDI + 8) = 6;
  *(undefined8 *)(in_RDI + 0x18) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 10;
  pvVar1 = CTcPrsMem::alloc(unaff_retaddr,in_RDI);
  *(void **)(in_RDI + 0x20) = pvVar1;
  return;
}

Assistant:

void CTcGramProdTok::set_match_part_list()
{
    const size_t init_alo = 10;

    /* remember the type */
    typ_ = TCGRAM_PART_OF_SPEECH_LIST;

    /* we have nothing in the list yet */
    val_.prop_list_.len_ = 0;

    /* set the initial allocation size */
    val_.prop_list_.alo_ = init_alo;

    /* allocate the initial list */
    val_.prop_list_.arr_ = (tctarg_prop_id_t *)G_prsmem->alloc(
        init_alo * sizeof(val_.prop_list_.arr_[0]));
}